

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O1

int byteoffset(lua_State *L)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  lua_Integer def;
  long lVar6;
  long lVar7;
  size_t len;
  ulong local_30;
  
  pcVar3 = luaL_checklstring(L,1,&local_30);
  lVar4 = luaL_checkinteger(L,2);
  def = 1;
  if (lVar4 < 0) {
    def = local_30 + 1;
  }
  lVar5 = luaL_optinteger(L,3,def);
  if (lVar5 < 0) {
    if (local_30 < (ulong)-lVar5) {
      lVar5 = 0;
    }
    else {
      lVar5 = lVar5 + local_30 + 1;
    }
  }
  lVar6 = lVar5 + -1;
  if ((lVar5 < 1) || (lVar5 = lVar6, (long)local_30 < lVar6)) {
    lVar6 = lVar5;
    luaL_argerror(L,3,"position out of bounds");
  }
  if (lVar4 == 0) {
    lVar5 = 0;
  }
  else if (lVar4 < 0) {
    lVar7 = lVar6;
    if (lVar6 < 1) {
      lVar5 = 1;
    }
    else {
      do {
        lVar6 = 1;
        if (lVar7 < 1) {
          lVar6 = lVar7;
        }
        if (1 < lVar7) {
          lVar6 = lVar7;
        }
        lVar6 = lVar6 + -1;
        lVar5 = lVar4 + 1;
      } while ((lVar4 < -1) && (bVar1 = 1 < lVar7, lVar4 = lVar5, lVar7 = lVar6, bVar1));
    }
  }
  else {
    for (; (lVar5 = lVar4 + -1, 1 < lVar4 && (lVar6 < (long)local_30)); lVar6 = lVar6 + 1) {
      lVar4 = lVar5;
    }
  }
  if (lVar5 == 0) {
    lua_pushinteger(L,lVar6 + 1);
    if (pcVar3[lVar6] < '\0') {
      lVar6 = lVar6 + 1;
    }
    lua_pushinteger(L,lVar6 + 1);
    iVar2 = 2;
  }
  else {
    lua_pushnil(L);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int byteoffset (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer n  = luaL_checkinteger(L, 2);
  lua_Integer posi = (n >= 0) ? 1 : cast_st2S(len) + 1;
  posi = u_posrelat(luaL_optinteger(L, 3, posi), len);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 3,
                   "position out of bounds");
  if (n == 0) {
    /* find beginning of current byte sequence */
    while (posi > 0 && iscontp(s + posi)) posi--;
  }
  else {
    if (iscontp(s + posi))
      return luaL_error(L, "initial position is a continuation byte");
    if (n < 0) {
      while (n < 0 && posi > 0) {  /* move back */
        do {  /* find beginning of previous character */
          posi--;
        } while (posi > 0 && iscontp(s + posi));
        n++;
      }
    }
    else {
      n--;  /* do not move for 1st character */
      while (n > 0 && posi < (lua_Integer)len) {
        do {  /* find beginning of next character */
          posi++;
        } while (iscontp(s + posi));  /* (cannot pass final '\0') */
        n--;
      }
    }
  }
  if (n != 0) {  /* did not find given character? */
    luaL_pushfail(L);
    return 1;
  }
  lua_pushinteger(L, posi + 1);  /* initial position */
  if ((s[posi] & 0x80) != 0) {  /* multi-byte character? */
    do {
      posi++;
    } while (iscontp(s + posi + 1));  /* skip to final byte */
  }
  /* else one-byte character: final position is the initial one */
  lua_pushinteger(L, posi + 1);  /* 'posi' now is the final position */
  return 2;
}